

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall
SpeciesTracker::IncrementRibo(SpeciesTracker *this,string *transcript_name,int copy_number)

{
  int iVar1;
  size_type sVar2;
  mapped_type_conflict *pmVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int copy_number_local;
  string *transcript_name_local;
  SpeciesTracker *this_local;
  
  local_1c = copy_number;
  psStack_18 = transcript_name;
  transcript_name_local = (string *)this;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->ribo_per_transcript_,transcript_name);
  iVar1 = local_1c;
  if (sVar2 == 0) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->ribo_per_transcript_,psStack_18);
    *pmVar3 = iVar1;
  }
  else {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->ribo_per_transcript_,psStack_18);
    *pmVar3 = iVar1 + *pmVar3;
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->ribo_per_transcript_,psStack_18);
  if (*pmVar3 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_40,"Ribosome count less than 0.",psStack_18);
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SpeciesTracker::IncrementRibo(const std::string &transcript_name,
                                   int copy_number) {
  if (ribo_per_transcript_.count(transcript_name) == 0) {
    ribo_per_transcript_[transcript_name] = copy_number;
  } else {
    ribo_per_transcript_[transcript_name] += copy_number;
  }
  if (ribo_per_transcript_[transcript_name] < 0) {
    throw std::runtime_error("Ribosome count less than 0." + transcript_name);
  }
}